

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::PrintDescriptor
          (Generator *this,Descriptor *message_descriptor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Printer *pPVar2;
  long lVar3;
  int iVar4;
  mapped_type *pmVar5;
  long lVar6;
  Syntax syntax;
  int i;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar7;
  Descriptor *descriptor;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  byte bVar11;
  string options_string_1;
  string local_230;
  Descriptor *local_210;
  long local_208;
  string local_200;
  DescriptorProto edp;
  string options_string;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  char required_function_arguments [91];
  
  bVar11 = 0;
  PrintNestedDescriptors(this,message_descriptor);
  io::Printer::Print(this->printer_,"\n");
  pPVar2 = this->printer_;
  ModuleLevelDescriptorName<google::protobuf::Descriptor>((string *)&edp,this,message_descriptor);
  io::Printer::Print(pPVar2,"$descriptor_name$ = _descriptor.Descriptor(\n","descriptor_name",
                     (string *)&edp);
  if (edp.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)&edp._has_bits_) {
    operator_delete((void *)edp.super_Message.super_MessageLite._vptr_MessageLite,edp._16_8_ + 1);
  }
  io::Printer::Indent(this->printer_);
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &m._M_t._M_impl.super__Rb_tree_header._M_header;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  edp.super_Message.super_MessageLite._vptr_MessageLite = (MessageLite)&edp._has_bits_;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&edp,"name","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&edp);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if (edp.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)&edp._has_bits_) {
    operator_delete((void *)edp.super_Message.super_MessageLite._vptr_MessageLite,edp._16_8_ + 1);
  }
  edp.super_Message.super_MessageLite._vptr_MessageLite = (MessageLite)&edp._has_bits_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&edp,"full_name","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&edp);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if (edp.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)&edp._has_bits_) {
    operator_delete((void *)edp.super_Message.super_MessageLite._vptr_MessageLite,edp._16_8_ + 1);
  }
  edp.super_Message.super_MessageLite._vptr_MessageLite = (MessageLite)&edp._has_bits_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&edp,"file","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&edp);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x36166c);
  if (edp.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)&edp._has_bits_) {
    operator_delete((void *)edp.super_Message.super_MessageLite._vptr_MessageLite,edp._16_8_ + 1);
  }
  pcVar8 = 
  "name=\'$name$\',\nfull_name=\'$full_name$\',\nfilename=None,\nfile=$file$,\ncontaining_type=None,\n"
  ;
  pcVar9 = required_function_arguments;
  for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
    *(undefined8 *)pcVar9 = *(undefined8 *)pcVar8;
    pcVar8 = pcVar8 + ((ulong)bVar11 * -2 + 1) * 8;
    pcVar9 = pcVar9 + (ulong)bVar11 * -0x10 + 8;
  }
  required_function_arguments[0x5a] = '\0';
  required_function_arguments[0x58] = ',';
  required_function_arguments[0x59] = '\n';
  io::Printer::Print(this->printer_,&m,required_function_arguments);
  PrintFieldsInDescriptor(this,message_descriptor);
  PrintExtensionsInDescriptor(this,message_descriptor);
  io::Printer::Print(this->printer_,"nested_types=[");
  local_210 = message_descriptor;
  if (0 < *(int *)(message_descriptor + 0x48)) {
    lVar10 = 0;
    lVar6 = 0;
    do {
      ModuleLevelDescriptorName<google::protobuf::Descriptor>
                ((string *)&edp,this,(Descriptor *)(*(long *)(local_210 + 0x50) + lVar10));
      io::Printer::Print(this->printer_,"$name$, ","name",(string *)&edp);
      if (edp.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)&edp._has_bits_) {
        operator_delete((void *)edp.super_Message.super_MessageLite._vptr_MessageLite,edp._16_8_ + 1
                       );
      }
      lVar6 = lVar6 + 1;
      lVar10 = lVar10 + 0xa8;
    } while (lVar6 < *(int *)(local_210 + 0x48));
  }
  descriptor = local_210;
  io::Printer::Print(this->printer_,"],\n");
  io::Printer::Print(this->printer_,"enum_types=[\n");
  io::Printer::Indent(this->printer_);
  if (0 < *(int *)(descriptor + 0x58)) {
    lVar10 = 0;
    lVar6 = 0;
    do {
      ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
                ((string *)&edp,this,(EnumDescriptor *)(*(long *)(descriptor + 0x60) + lVar10));
      io::Printer::Print(this->printer_,
                         (char *)edp.super_Message.super_MessageLite._vptr_MessageLite);
      io::Printer::Print(this->printer_,",\n");
      if (edp.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)&edp._has_bits_) {
        operator_delete((void *)edp.super_Message.super_MessageLite._vptr_MessageLite,edp._16_8_ + 1
                       );
      }
      lVar6 = lVar6 + 1;
      lVar10 = lVar10 + 0x38;
      descriptor = local_210;
    } while (lVar6 < *(int *)(local_210 + 0x58));
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,"],\n");
  options_string._M_dataplus._M_p = (pointer)&options_string.field_2;
  options_string._M_string_length = 0;
  options_string.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString(*(MessageLite **)(descriptor + 0x20),&options_string);
  pPVar2 = this->printer_;
  options_string_1._M_dataplus._M_p = (pointer)&options_string_1.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options_string_1,"MessageOptions","");
  OptionsValue((string *)&edp,this,&options_string_1,&options_string);
  pcVar8 = "False";
  if (0 < *(int *)(descriptor + 0x68)) {
    pcVar8 = "True";
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,pcVar8,pcVar8 + ((ulong)(0 < *(int *)(descriptor + 0x68)) ^ 5));
  (anonymous_namespace)::StringifySyntax_abi_cxx11_
            (&local_200,
             (_anonymous_namespace_ *)(ulong)*(uint *)(*(long *)(descriptor + 0x10) + 0x8c),syntax);
  io::Printer::Print(pPVar2,
                     "options=$options_value$,\nis_extendable=$extendable$,\nsyntax=\'$syntax$\'",
                     "options_value",(string *)&edp,"extendable",&local_230,"syntax",&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (edp.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)&edp._has_bits_) {
    operator_delete((void *)edp.super_Message.super_MessageLite._vptr_MessageLite,edp._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)options_string_1._M_dataplus._M_p != &options_string_1.field_2) {
    operator_delete(options_string_1._M_dataplus._M_p,
                    options_string_1.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Print(this->printer_,",\n");
  io::Printer::Print(this->printer_,"extension_ranges=[");
  if (0 < *(int *)(descriptor + 0x68)) {
    lVar6 = 0;
    uVar7 = extraout_RDX;
    do {
      lVar10 = *(long *)(descriptor + 0x70);
      pPVar2 = this->printer_;
      SimpleItoa_abi_cxx11_
                ((string *)&edp,(protobuf *)(ulong)*(uint *)(lVar10 + lVar6 * 8),(int)uVar7);
      SimpleItoa_abi_cxx11_
                (&options_string_1,(protobuf *)(ulong)*(uint *)(lVar10 + 4 + lVar6 * 8),i);
      io::Printer::Print(pPVar2,"($start$, $end$), ","start",(string *)&edp,"end",&options_string_1)
      ;
      descriptor = local_210;
      uVar7 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)options_string_1._M_dataplus._M_p != &options_string_1.field_2) {
        operator_delete(options_string_1._M_dataplus._M_p,
                        options_string_1.field_2._M_allocated_capacity + 1);
        uVar7 = extraout_RDX_01;
      }
      if (edp.super_Message.super_MessageLite._vptr_MessageLite != (MessageLite)&edp._has_bits_) {
        operator_delete((void *)edp.super_Message.super_MessageLite._vptr_MessageLite,edp._16_8_ + 1
                       );
        uVar7 = extraout_RDX_02;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)(descriptor + 0x68));
  }
  io::Printer::Print(this->printer_,"],\n");
  io::Printer::Print(this->printer_,"oneofs=[\n");
  io::Printer::Indent(this->printer_);
  if (0 < *(int *)(descriptor + 0x38)) {
    lVar6 = 0;
    lVar10 = 0;
    do {
      lVar3 = *(long *)(descriptor + 0x40);
      edp._internal_metadata_.
      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
      .ptr_._0_4_ = 0;
      edp._has_bits_.has_bits_[0] = (uint32  [1])0x0;
      edp._cached_size_ = 0;
      edp.field_.super_RepeatedPtrFieldBase.arena_ = (Arena *)&edp._internal_metadata_;
      edp.field_.super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
      options_string_1._M_dataplus._M_p = (pointer)&options_string_1.field_2;
      local_208 = lVar6;
      edp.field_.super_RepeatedPtrFieldBase._8_8_ = edp.field_.super_RepeatedPtrFieldBase.arena_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&options_string_1,"name","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&edp,&options_string_1);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)options_string_1._M_dataplus._M_p != &options_string_1.field_2) {
        operator_delete(options_string_1._M_dataplus._M_p,
                        options_string_1.field_2._M_allocated_capacity + 1);
      }
      options_string_1._M_dataplus._M_p = (pointer)&options_string_1.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&options_string_1,"full_name","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&edp,&options_string_1);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)options_string_1._M_dataplus._M_p != &options_string_1.field_2) {
        operator_delete(options_string_1._M_dataplus._M_p,
                        options_string_1.field_2._M_allocated_capacity + 1);
      }
      SimpleItoa_abi_cxx11_
                (&options_string_1,
                 (protobuf *)
                 (ulong)(uint)((int)((ulong)((lVar3 - *(long *)(*(long *)(lVar3 + 0x10 + local_208)
                                                               + 0x40)) + local_208) >> 4) *
                              -0x55555555),(int)local_208);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"index","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&edp,&local_230);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&options_string_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)options_string_1._M_dataplus._M_p != &options_string_1.field_2) {
        operator_delete(options_string_1._M_dataplus._M_p,
                        options_string_1.field_2._M_allocated_capacity + 1);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"OneofOptions","");
      MessageLite::SerializeAsString_abi_cxx11_
                (&local_200,*(MessageLite **)(lVar3 + 0x28 + local_208));
      paVar1 = &local_200.field_2;
      OptionsValue(&options_string_1,this,&local_230,&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != paVar1) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      iVar4 = std::__cxx11::string::compare((char *)&options_string_1);
      if (iVar4 == 0) {
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"options","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&edp,&local_230);
        std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x357dff);
      }
      else {
        std::operator+(&local_230,", options=",&options_string_1);
        local_200._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"options","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&edp,&local_200);
        std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != paVar1) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Print(this->printer_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&edp,
                         "_descriptor.OneofDescriptor(\n  name=\'$name$\', full_name=\'$full_name$\',\n  index=$index$, containing_type=None, fields=[]$options$),\n"
                        );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)options_string_1._M_dataplus._M_p != &options_string_1.field_2) {
        operator_delete(options_string_1._M_dataplus._M_p,
                        options_string_1.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&edp);
      lVar10 = lVar10 + 1;
      lVar6 = local_208 + 0x30;
      descriptor = local_210;
    } while (lVar10 < *(int *)(local_210 + 0x38));
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,"],\n");
  DescriptorProto::DescriptorProto(&edp);
  PrintSerializedPbInterval<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
            (this,descriptor,&edp);
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,")\n");
  DescriptorProto::~DescriptorProto(&edp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)options_string._M_dataplus._M_p != &options_string.field_2) {
    operator_delete(options_string._M_dataplus._M_p,
                    CONCAT71(options_string.field_2._M_allocated_capacity._1_7_,
                             options_string.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&m._M_t);
  return;
}

Assistant:

void Generator::PrintDescriptor(const Descriptor& message_descriptor) const {
  PrintNestedDescriptors(message_descriptor);

  printer_->Print("\n");
  printer_->Print("$descriptor_name$ = _descriptor.Descriptor(\n",
                  "descriptor_name",
                  ModuleLevelDescriptorName(message_descriptor));
  printer_->Indent();
  std::map<string, string> m;
  m["name"] = message_descriptor.name();
  m["full_name"] = message_descriptor.full_name();
  m["file"] = kDescriptorKey;
  const char required_function_arguments[] =
      "name='$name$',\n"
      "full_name='$full_name$',\n"
      "filename=None,\n"
      "file=$file$,\n"
      "containing_type=None,\n";
  printer_->Print(m, required_function_arguments);
  PrintFieldsInDescriptor(message_descriptor);
  PrintExtensionsInDescriptor(message_descriptor);

  // Nested types
  printer_->Print("nested_types=[");
  for (int i = 0; i < message_descriptor.nested_type_count(); ++i) {
    const string nested_name = ModuleLevelDescriptorName(
        *message_descriptor.nested_type(i));
    printer_->Print("$name$, ", "name", nested_name);
  }
  printer_->Print("],\n");

  // Enum types
  printer_->Print("enum_types=[\n");
  printer_->Indent();
  for (int i = 0; i < message_descriptor.enum_type_count(); ++i) {
    const string descriptor_name = ModuleLevelDescriptorName(
        *message_descriptor.enum_type(i));
    printer_->Print(descriptor_name.c_str());
    printer_->Print(",\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
  string options_string;
  message_descriptor.options().SerializeToString(&options_string);
  printer_->Print(
      "options=$options_value$,\n"
      "is_extendable=$extendable$,\n"
      "syntax='$syntax$'",
      "options_value", OptionsValue("MessageOptions", options_string),
      "extendable", message_descriptor.extension_range_count() > 0 ?
                      "True" : "False",
      "syntax", StringifySyntax(message_descriptor.file()->syntax()));
  printer_->Print(",\n");

  // Extension ranges
  printer_->Print("extension_ranges=[");
  for (int i = 0; i < message_descriptor.extension_range_count(); ++i) {
    const Descriptor::ExtensionRange* range =
        message_descriptor.extension_range(i);
    printer_->Print("($start$, $end$), ",
                    "start", SimpleItoa(range->start),
                    "end", SimpleItoa(range->end));
  }
  printer_->Print("],\n");
  printer_->Print("oneofs=[\n");
  printer_->Indent();
  for (int i = 0; i < message_descriptor.oneof_decl_count(); ++i) {
    const OneofDescriptor* desc = message_descriptor.oneof_decl(i);
    std::map<string, string> m;
    m["name"] = desc->name();
    m["full_name"] = desc->full_name();
    m["index"] = SimpleItoa(desc->index());
    string options_string =
        OptionsValue("OneofOptions", desc->options().SerializeAsString());
    if (options_string == "None") {
      m["options"] = "";
    } else {
      m["options"] = ", options=" + options_string;
    }
    printer_->Print(
        m,
        "_descriptor.OneofDescriptor(\n"
        "  name='$name$', full_name='$full_name$',\n"
        "  index=$index$, containing_type=None, fields=[]$options$),\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
  // Serialization of proto
  DescriptorProto edp;
  PrintSerializedPbInterval(message_descriptor, edp);

  printer_->Outdent();
  printer_->Print(")\n");
}